

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingPoint.cpp
# Opt level: O0

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Implementation::FloatComparator<long_double>::operator()
          (FloatComparator<long_double> *this,longdouble actual,longdouble expected)

{
  bool bVar1;
  int __x;
  FloatComparator<long_double> *pFVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble difference;
  longdouble absB;
  longdouble absA;
  longdouble expected_local;
  longdouble actual_local;
  FloatComparator<long_double> *this_local;
  
  if (((actual == expected) && (!NAN(actual) && !NAN(expected))) ||
     ((NAN(actual) && (NAN(expected))))) {
    Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
               ((long)&this_local + 7));
    return (ComparisonStatusFlags)this_local._7_1_;
  }
  pFVar2 = this;
  std::abs((int)this);
  __x = (int)pFVar2;
  std::abs(__x);
  std::abs(__x);
  if ((actual != (longdouble)0) || (NAN(actual) || NAN((longdouble)0))) {
    if (((expected != (longdouble)0) || (NAN(expected) || NAN((longdouble)0))) &&
       (Utility::Implementation::FloatPrecision<long_double>::epsilon(), bVar1 = in_ST3 <= in_ST2,
       in_ST3 = in_ST4, bVar1)) {
      Utility::Implementation::FloatPrecision<long_double>::epsilon();
      if (in_ST2 / (in_ST1 + in_ST0) < in_ST4) {
        Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::
        EnumSet((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
                ((long)&this_local + 7));
        return (ComparisonStatusFlags)this_local._7_1_;
      }
      goto LAB_0012222a;
    }
  }
  Utility::Implementation::FloatPrecision<long_double>::epsilon();
  if (in_ST2 < in_ST3) {
    Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
               ((long)&this_local + 7));
    return (ComparisonStatusFlags)this_local._7_1_;
  }
LAB_0012222a:
  this->_actualValue = actual;
  this->_expectedValue = expected;
  Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
            ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
             ((long)&this_local + 7),Failed);
  return (ComparisonStatusFlags)this_local._7_1_;
}

Assistant:

ComparisonStatusFlags FloatComparator<T>::operator()(T actual, T expected) {
    /* Shortcut for binary equality, infinites and NaN */
    if(actual == expected || (actual != actual && expected != expected))
        return {};

    const T absA = std::abs(actual);
    const T absB = std::abs(expected);
    const T difference = std::abs(actual - expected);

    /* One of the numbers is zero or both are extremely close to it, relative
       error is meaningless */
    if((actual == T{} || expected == T{} || difference < Utility::Implementation::FloatPrecision<T>::epsilon())) {
        if(difference < Utility::Implementation::FloatPrecision<T>::epsilon())
            return {};
    }

    /* Relative error */
    else if(difference/(absA + absB) < Utility::Implementation::FloatPrecision<T>::epsilon())
        return {};

    _actualValue = actual;
    _expectedValue = expected;
    return ComparisonStatusFlag::Failed;
}